

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

bool xray_re::xr_ini_file::is_true(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = xr_stricmp(value,"true");
  if ((((iVar1 != 0) && (iVar1 = xr_stricmp(value,"on"), iVar1 != 0)) &&
      (iVar1 = xr_stricmp(value,"yes"), iVar1 != 0)) && (iVar1 = strcmp(value,"1"), iVar1 != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool xr_ini_file::is_true(const char* value)
{
	if (xr_stricmp(value, "true") == 0 || xr_stricmp(value, "on") == 0 ||
			xr_stricmp(value, "yes") == 0 || std::strcmp(value, "1") == 0) {
		return true;
	}
	return false;
}